

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_NoPointsHand_NotMultiWait_Test::
TEST_DoublingFactorCounterTest_Not_NoPointsHand_NotMultiWait_Test
          (TEST_DoublingFactorCounterTest_Not_NoPointsHand_NotMultiWait_Test *this)

{
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_NotMultiWait_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_DoublingFactorCounterTest_Not_NoPointsHand_NotMultiWait_Test_00251ab8;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_NoPointsHand_NotMultiWait)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);

	h.add(Tile::NineOfCircles);
	h.add(Tile::EightOfCircles);
	h.add(Tile::SevenOfCircles);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}